

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O1

uint __thiscall glslang::TSmallArrayVector::getDimSize(TSmallArrayVector *this,int i)

{
  TVector<glslang::TArraySize> *pTVar1;
  pointer pTVar2;
  
  pTVar1 = this->sizes;
  if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
     (pTVar2 = (pTVar1->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(pTVar1->
                             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ).
                             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) >> 4))) {
    return pTVar2[i].size;
  }
  __assert_fail("sizes != nullptr && (int)sizes->size() > i",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                ,0xae,"unsigned int glslang::TSmallArrayVector::getDimSize(int) const");
}

Assistant:

unsigned int getDimSize(int i) const
    {
        assert(sizes != nullptr && (int)sizes->size() > i);
        return (*sizes)[i].size;
    }